

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManComputeTest(Gia_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  abctime aVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  abctime time;
  abctime time_00;
  char *pcVar8;
  int level;
  int v;
  
  aVar2 = Abc_Clock();
  pcVar8 = (char *)0x5;
  Ga2_ManMarkup(p,5,0);
  aVar3 = Abc_Clock();
  pGVar4 = (Gia_Man_t *)(aVar3 - aVar2);
  Abc_PrintTime((int)pGVar4,pcVar8,time);
  uVar7 = 0;
  for (v = 0; level = (int)pGVar4, v < p->nObjs; v = v + 1) {
    pGVar4 = p;
    pGVar5 = Gia_ManObj(p,v);
    level = (int)pGVar4;
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(undefined8 *)pGVar5;
    uVar6 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x3f);
    if ((~uVar1 & 0x1fffffff) == 0) {
      uVar6 = 0;
    }
    if ((int)uVar1 < 0) {
      uVar6 = 0;
    }
    uVar7 = uVar6 + uVar7;
  }
  pcVar8 = "Marked AND nodes = %6d.  ";
  Abc_Print(level,"Marked AND nodes = %6d.  ",(ulong)uVar7);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar2,pcVar8,time_00);
  return;
}

Assistant:

void Ga2_ManComputeTest( Gia_Man_t * p )
{
    abctime clk;
//    unsigned uTruth;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    clk = Abc_Clock();
    Ga2_ManMarkup( p, 5, 0 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
//        uTruth = Ga2_ObjTruth( p, pObj );
//        printf( "%6d : ", Counter );
//        Kit_DsdPrintFromTruth( &uTruth, Ga2_ObjLeaveNum(p, pObj) ); 
//        printf( "\n" );
        Counter++;
    }
    Abc_Print( 1, "Marked AND nodes = %6d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}